

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_math_imul(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  int64_t iVar3;
  JSValue JVar4;
  int b;
  int a;
  JSValueUnion local_28;
  int local_1c;
  
  local_28 = (JSValueUnion)(argv->u).ptr;
  JVar4 = *argv;
  if (0xfffffff4 < (uint)argv->tag) {
    *(int *)local_28.ptr = *local_28.ptr + 1;
  }
  iVar1 = JS_ToInt32Free(ctx,&local_1c,JVar4);
  iVar3 = 6;
  if (iVar1 == 0) {
    local_28 = argv[1].u;
    JVar4 = argv[1];
    if (0xfffffff4 < (uint)argv[1].tag) {
      *(int *)local_28.ptr = *local_28.ptr + 1;
    }
    iVar1 = JS_ToInt32Free(ctx,&local_28.int32,JVar4);
    if (iVar1 == 0) {
      JVar2._0_4_ = local_28.int32 * local_1c;
      JVar2._4_4_ = 0;
      iVar3 = 0;
      goto LAB_0016c990;
    }
  }
  JVar2.float64 = 0.0;
LAB_0016c990:
  JVar4.tag = iVar3;
  JVar4.u.float64 = JVar2.float64;
  return JVar4;
}

Assistant:

static JSValue js_math_imul(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    int a, b;

    if (JS_ToInt32(ctx, &a, argv[0]))
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &b, argv[1]))
        return JS_EXCEPTION;
    /* purposely ignoring overflow */
    return JS_NewInt32(ctx, a * b);
}